

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintSExpression::TypePrinter::TypePrinter
          (TypePrinter *this,PrintSExpression *parent,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer pHVar1;
  size_type sVar2;
  size_type sVar3;
  mapped_type *this_00;
  unsigned_long __val;
  __node_base *p_Var4;
  undefined1 local_110 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  size_t sStack_d0;
  TypeNames local_c8;
  pointer local_78;
  pointer local_70;
  PrintSExpression *local_68;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *local_60;
  undefined1 auStack_58 [8];
  Name name;
  key_type local_40;
  HeapType type;
  
  this->parent = parent;
  (this->fallback).funcCount = 0;
  (this->fallback).contCount = 0;
  (this->fallback).structCount = 0;
  (this->fallback).arrayCount = 0;
  (this->fallback).nameCache._M_h._M_buckets = &(this->fallback).nameCache._M_h._M_single_bucket;
  (this->fallback).nameCache._M_h._M_bucket_count = 1;
  (this->fallback).nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fallback).nameCache._M_h._M_element_count = 0;
  (this->fallback).nameCache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fallback).nameCache._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fallback).nameCache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fallbackNames)._M_h._M_buckets = &(this->fallbackNames)._M_h._M_single_bucket;
  (this->fallbackNames)._M_h._M_bucket_count = 1;
  (this->fallbackNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fallbackNames)._M_h._M_element_count = 0;
  (this->fallbackNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fallbackNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fallbackNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (parent->currModule != (Module *)0x0) {
    local_60 = &(this->fallback).nameCache;
    type.id = (uintptr_t)&this->fallbackNames;
    local_110 = (undefined1  [8])&usedNames._M_h._M_rehash_policy._M_next_resize;
    usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
    usedNames._M_h._M_bucket_count = 0;
    usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
    usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    usedNames._M_h._M_rehash_policy._4_4_ = 0;
    usedNames._M_h._M_rehash_policy._M_next_resize = 0;
    p_Var4 = &(parent->currModule->typeNames)._M_h._M_before_begin;
    local_68 = parent;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_110,(value_type *)(p_Var4 + 2));
    }
    local_70 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    __val = 0;
    pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while (pHVar1 != local_70) {
      local_40.id = pHVar1->id;
      local_78 = pHVar1;
      sVar2 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::count(&(local_68->currModule->typeNames)._M_h,&local_40);
      if (sVar2 == 0) {
        auStack_58 = (undefined1  [8])0x0;
        name.super_IString.str._M_len = 0;
        do {
          std::__cxx11::to_string((string *)&local_c8,__val);
          IString::IString((IString *)&usedNames._M_h._M_single_bucket,(string *)&local_c8);
          auStack_58 = (undefined1  [8])usedNames._M_h._M_single_bucket;
          name.super_IString.str._M_len = sStack_d0;
          std::__cxx11::string::~string((string *)&local_c8);
          sVar3 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_110,(key_type *)auStack_58);
          __val = __val + 1;
        } while (sVar3 != 0);
        local_c8.name.super_IString.str._M_len = (size_t)auStack_58;
        local_c8.name.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        local_c8.fieldNames._M_h._M_buckets = &local_c8.fieldNames._M_h._M_single_bucket;
        local_c8.fieldNames._M_h._M_bucket_count = 1;
        local_c8.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_c8.fieldNames._M_h._M_element_count = 0;
        local_c8.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_c8.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
        local_c8.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
        local_c8.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
        this_00 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)type.id,&local_40);
        TypeNames::operator=(this_00,&local_c8);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_c8.fieldNames._M_h);
      }
      else {
        __val = __val + 1;
      }
      pHVar1 = local_78 + 1;
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_110);
  }
  return;
}

Assistant:

TypePrinter(PrintSExpression& parent, const std::vector<HeapType>& types)
      : parent(parent) {
      if (!parent.currModule) {
        return;
      }
      std::unordered_set<Name> usedNames;
      for (auto& [_, names] : parent.currModule->typeNames) {
        usedNames.insert(names.name);
      }
      size_t i = 0;
      // Use indices for any remaining type names, skipping any that are already
      // used.
      for (auto type : types) {
        if (parent.currModule->typeNames.count(type)) {
          ++i;
          continue;
        }
        Name name;
        do {
          name = std::to_string(i++);
        } while (usedNames.count(name));
        fallbackNames[type] = {name, {}};
      }
    }